

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

int yang_extcomplex_node
              (lys_ext_instance_complex *ext,char *parent_name,char *node_name,lys_node *node,
              LY_STMT stmt)

{
  LY_STMT LVar1;
  void *pvVar2;
  LY_ECODE code;
  int iVar3;
  lyext_substmt *local_40;
  lyext_substmt *info;
  
  pvVar2 = lys_ext_complex_get_substmt(stmt,ext,&local_40);
  if (pvVar2 == (void *)0x0) {
    code = LYE_INCHILDSTMT;
LAB_0014dd5d:
    ly_vlog(code,LY_VLOG_NONE,(void *)0x0,node_name,parent_name);
    iVar3 = 1;
  }
  else {
    iVar3 = 0;
    if (local_40->cardinality < LY_STMT_CARD_SOME) {
      code = LYE_TOOMANY;
      info = (lyext_substmt *)parent_name;
      for (; node != (lys_node *)0x0; node = node->next) {
        LVar1 = lys_snode2stmt(node->nodetype);
        parent_name = (char *)info;
        if (LVar1 == stmt) goto LAB_0014dd5d;
      }
    }
  }
  return iVar3;
}

Assistant:

int
yang_extcomplex_node(struct lys_ext_instance_complex *ext, char *parent_name, char *node_name,
                     struct lys_node *node, LY_STMT stmt)
{
    struct lyext_substmt *info;
    struct lys_node **snode, *siter;

    snode = lys_ext_complex_get_substmt(stmt, ext, &info);
    if (!snode) {
        LOGVAL(LYE_INCHILDSTMT, LY_VLOG_NONE, NULL, node_name, parent_name);
        return EXIT_FAILURE;
    }
    if (info->cardinality < LY_STMT_CARD_SOME) {
        LY_TREE_FOR(node, siter) {
            if (stmt == lys_snode2stmt(siter->nodetype)) {
                LOGVAL(LYE_TOOMANY, LY_VLOG_NONE, NULL, node_name, parent_name);
                return EXIT_FAILURE;
            }
        }
    }

    return EXIT_SUCCESS;
}